

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderFlow.cpp
# Opt level: O1

void __thiscall SenderFlow::SenderFlow(SenderFlow *this,string *bind,int port)

{
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  SenderFlowEx *pSVar4;
  int *piVar5;
  char *pcVar6;
  int linger;
  stringstream notf_addr;
  stringstream stream_addr;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  long local_398 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  string local_380;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  pvVar2 = (void *)zmq_ctx_new();
  this->m_context = pvVar2;
  pvVar2 = (void *)zmq_socket(pvVar2,8);
  this->m_stream_socket = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,1);
  this->m_notif_socket = pvVar2;
  local_388 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_388;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(bind->_M_dataplus)._M_p,bind->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::ostream::operator<<(poVar3,port);
  std::__cxx11::stringstream::stringstream(local_340);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_330,(bind->_M_dataplus)._M_p,bind->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::ostream::operator<<(poVar3,port + 1);
  pvVar2 = this->m_stream_socket;
  std::__cxx11::stringbuf::str();
  iVar1 = zmq_bind(pvVar2,CONCAT44(uStack_3a4,local_3a8));
  if ((long *)CONCAT44(uStack_3a4,local_3a8) != local_398) {
    operator_delete((long *)CONCAT44(uStack_3a4,local_3a8),local_398[0] + 1);
  }
  if (iVar1 == -1) {
    pSVar4 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,pcVar6,(allocator<char> *)&local_3a8);
    SenderFlowEx::SenderFlowEx(pSVar4,&local_360);
    __cxa_throw(pSVar4,&SenderFlowEx::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = this->m_notif_socket;
  std::__cxx11::stringbuf::str();
  iVar1 = zmq_bind(pvVar2,CONCAT44(uStack_3a4,local_3a8));
  if ((long *)CONCAT44(uStack_3a4,local_3a8) != local_398) {
    operator_delete((long *)CONCAT44(uStack_3a4,local_3a8),local_398[0] + 1);
  }
  if (iVar1 != -1) {
    local_3a8 = 0xffffffff;
    zmq_setsockopt(this->m_stream_socket,0x11,&local_3a8,4);
    zmq_setsockopt(this->m_notif_socket,0x11,&local_3a8,4);
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    return;
  }
  pSVar4 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,pcVar6,(allocator<char> *)&local_3a8);
  SenderFlowEx::SenderFlowEx(pSVar4,&local_380);
  __cxa_throw(pSVar4,&SenderFlowEx::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SenderFlow::SenderFlow(std::string bind, int port) :
    m_context(zmq_ctx_new()),
    m_stream_socket(zmq_socket(m_context, ZMQ_PUSH)),
    m_notif_socket(zmq_socket(m_context, ZMQ_PUB))
{
    // prepare full address
    std::stringstream stream_addr;
    stream_addr << bind << ":" << port;
    std::stringstream notf_addr;
    notf_addr << bind << ":" << (port + 1);
    // bind the port for the stream endpoint
    int rc = zmq_bind(m_stream_socket, stream_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    // bind the port for the notification channel endpoint
    rc = zmq_bind(m_notif_socket, notf_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    int linger = -1;
    zmq_setsockopt(m_stream_socket, ZMQ_LINGER, &linger, sizeof(linger));
    zmq_setsockopt(m_notif_socket, ZMQ_LINGER, &linger, sizeof(linger));
}